

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_7::TwoLevelIterator::InitDataBlock(TwoLevelIterator *this)

{
  int iVar1;
  undefined4 extraout_var;
  Iterator *data_iter;
  ulong __n;
  ulong extraout_RDX;
  bool bVar2;
  Slice handle;
  Slice local_30;
  
  if ((this->index_iter_).valid_ == false) {
    SetDataIterator(this,(Iterator *)0x0);
    return;
  }
  iVar1 = (*((this->index_iter_).iter_)->_vptr_Iterator[9])();
  local_30.data_ = (char *)CONCAT44(extraout_var,iVar1);
  if ((this->data_iter_).iter_ != (Iterator *)0x0) {
    __n = (this->data_block_handle_)._M_string_length;
    bVar2 = extraout_RDX == __n;
    if (extraout_RDX < __n) {
      __n = extraout_RDX;
    }
    iVar1 = bcmp(local_30.data_,(this->data_block_handle_)._M_dataplus._M_p,__n);
    if (iVar1 == 0 && bVar2) {
      return;
    }
  }
  data_iter = (*this->block_function_)(this->arg_,&this->options_,&local_30);
  std::__cxx11::string::_M_replace
            ((ulong)&this->data_block_handle_,0,(char *)(this->data_block_handle_)._M_string_length,
             (ulong)local_30.data_);
  SetDataIterator(this,data_iter);
  return;
}

Assistant:

void TwoLevelIterator::InitDataBlock() {
  if (!index_iter_.Valid()) {
    SetDataIterator(nullptr);
  } else {
    Slice handle = index_iter_.value();
    if (data_iter_.iter() != nullptr &&
        handle.compare(data_block_handle_) == 0) {
      // data_iter_ is already constructed with this iterator, so
      // no need to change anything
    } else {
      Iterator* iter = (*block_function_)(arg_, options_, handle);
      data_block_handle_.assign(handle.data(), handle.size());
      SetDataIterator(iter);
    }
  }
}